

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void RulePrint(FILE *fp,rule *rp,int iCursor)

{
  symbol *psVar1;
  int local_30;
  int local_2c;
  int j;
  int i;
  symbol *sp;
  int iCursor_local;
  rule *rp_local;
  FILE *fp_local;
  
  fprintf((FILE *)fp,"%s ::=",rp->lhs->name);
  local_2c = 0;
  while( true ) {
    if (rp->nrhs < local_2c) {
      return;
    }
    if (local_2c == iCursor) {
      fprintf((FILE *)fp," *");
    }
    if (local_2c == rp->nrhs) break;
    psVar1 = rp->rhs[local_2c];
    if (psVar1->type == MULTITERMINAL) {
      fprintf((FILE *)fp," %s",(*psVar1->subsym)->name);
      for (local_30 = 1; local_30 < psVar1->nsubsym; local_30 = local_30 + 1) {
        fprintf((FILE *)fp,"|%s",psVar1->subsym[local_30]->name);
      }
    }
    else {
      fprintf((FILE *)fp," %s",psVar1->name);
    }
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void RulePrint(FILE *fp, struct rule *rp, int iCursor){
  struct symbol *sp;
  int i, j;
  fprintf(fp,"%s ::=",rp->lhs->name);
  for(i=0; i<=rp->nrhs; i++){
    if( i==iCursor ) fprintf(fp," *");
    if( i==rp->nrhs ) break;
    sp = rp->rhs[i];
    if( sp->type==MULTITERMINAL ){
      fprintf(fp," %s", sp->subsym[0]->name);
      for(j=1; j<sp->nsubsym; j++){
        fprintf(fp,"|%s",sp->subsym[j]->name);
      }
    }else{
      fprintf(fp," %s", sp->name);
    }
  }
}